

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene-access.cc
# Opt level: O3

expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
tinyusdz::tydra::anon_unknown_6::GetPrimProperty<tinyusdz::BlendShape>
          (expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,BlendShape *blendshape,string *prop_name,Property *out_prop)

{
  size_type *psVar1;
  fmt fVar2;
  bool bVar3;
  int iVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  vector<int,_std::allocator<int>_> *this;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX_00;
  vtable_type *pvVar7;
  vtable_type *extraout_RAX_01;
  vtable_type *extraout_RAX_02;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX_03;
  _Base_ptr args;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  optional<std::vector<int,_std::allocator<int>_>_> pv;
  string err;
  pointer *local_938;
  vector<int,_std::allocator<int>_> local_930;
  string local_918;
  storage_union local_8f8;
  undefined1 local_8e8 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_8c8;
  undefined1 local_8b8 [40];
  _Alloc_hider local_890;
  size_type local_888;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_880;
  storage_union local_870;
  vtable_type *local_860;
  bool local_858;
  undefined1 local_850 [32];
  undefined1 local_830 [24];
  AttrMetas AStack_818;
  storage_union local_610;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_600;
  undefined1 local_5f0 [1472];
  
  if (out_prop == (Property *)0x0) {
    local_610.dynamic = "[InternalError] nullptr in output Property is not allowed.";
    nonstd::expected_lite::
    expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::expected<const_char_*,_0>(__return_storage_ptr__,(unexpected_type<const_char_*> *)&local_610);
    return (expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)extraout_RAX;
  }
  local_918._M_dataplus._M_p = (pointer)&local_918.field_2;
  local_918._M_string_length = 0;
  local_918.field_2._M_local_buf[0] = '\0';
  iVar4 = ::std::__cxx11::string::compare((char *)prop_name);
  if (iVar4 == 0) {
    bVar3 = (anonymous_namespace)::
            ToProperty<std::vector<tinyusdz::value::vector3f,std::allocator<tinyusdz::value::vector3f>>>
                      (&blendshape->offsets,out_prop,&local_918);
    pvVar7 = (vtable_type *)CONCAT71(extraout_var,bVar3);
    if (bVar3) goto LAB_0031925e;
    local_938 = &local_930.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_938,"Convert Property {} failed: {}\n","");
    fmt::format<char[8],std::__cxx11::string>
              ((string *)local_8b8,(fmt *)&local_938,(string *)"offsets",(char (*) [8])&local_918,
               in_R8);
LAB_00318cfc:
    uVar5 = &local_600;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_8b8._0_8_ ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(local_8b8 + 0x10)) {
      local_600._8_8_ = local_8b8._24_8_;
      local_8b8._0_8_ = uVar5;
    }
    local_600._M_allocated_capacity._1_7_ = local_8b8._17_7_;
    local_600._M_local_buf[0] = local_8b8[0x10];
    (__return_storage_ptr__->contained).
    super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .m_has_value = false;
    psVar1 = (size_type *)
             ((long)&(__return_storage_ptr__->contained).
                     super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     .field_0 + 0x10);
    *(size_type **)
     &(__return_storage_ptr__->contained).
      super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      .field_0 = psVar1;
    if (local_8b8._0_8_ == uVar5) {
      *psVar1 = local_600._M_allocated_capacity;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->contained).
               super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               .field_0 + 0x18) = local_600._8_8_;
    }
    else {
      (__return_storage_ptr__->contained).
      super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      .field_0.m_error._M_dataplus._M_p = (pointer)local_8b8._0_8_;
      *(size_type *)
       ((long)&(__return_storage_ptr__->contained).
               super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               .field_0 + 0x10) = local_600._M_allocated_capacity;
    }
    (__return_storage_ptr__->contained).
    super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .field_0.m_error._M_string_length = local_8b8._8_8_;
LAB_0031905b:
    local_610.dynamic = &local_600;
    local_8b8._0_8_ = local_8b8 + 0x10;
    local_8b8[0x10] = '\0';
    local_8b8._8_8_ = 0;
    local_610._8_8_ = 0;
    local_600._M_allocated_capacity = local_600._M_allocated_capacity & 0xffffffffffffff00;
    if (local_938 !=
        &local_930.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_finish) {
      operator_delete(local_938,
                      (long)local_930.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_finish + 1);
      uVar5 = extraout_RAX_00;
    }
  }
  else {
    iVar4 = ::std::__cxx11::string::compare((char *)prop_name);
    if (iVar4 == 0) {
      bVar3 = (anonymous_namespace)::
              ToProperty<std::vector<tinyusdz::value::vector3f,std::allocator<tinyusdz::value::vector3f>>>
                        (&blendshape->normalOffsets,out_prop,&local_918);
      pvVar7 = (vtable_type *)CONCAT71(extraout_var_00,bVar3);
      if (!bVar3) {
        local_938 = &local_930.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_938,"Convert Property {} failed: {}\n","");
        fmt::format<char[14],std::__cxx11::string>
                  ((string *)local_8b8,(fmt *)&local_938,(string *)"normalOffsets",
                   (char (*) [14])&local_918,in_R8);
        goto LAB_00318cfc;
      }
    }
    else {
      iVar4 = ::std::__cxx11::string::compare((char *)prop_name);
      if (iVar4 == 0) {
        local_8b8._0_8_ = local_8b8 + 0x10;
        local_8b8._8_8_ = 0;
        local_8b8[0x10] = '\0';
        local_8b8[0x24] = false;
        local_888 = 0;
        local_880._M_local_buf[0] = '\0';
        local_860 = (vtable_type *)&linb::any::vtable_for_type<decltype(nullptr)>()::table;
        local_870.dynamic = (void *)0x0;
        local_858 = false;
        local_850._0_8_ = (pointer)0x0;
        local_850[8] = 0;
        local_850._9_7_ = 0;
        local_850[0x10] = 0;
        local_850._17_8_ = 0;
        AStack_818.interpolation.contained = (storage_t<tinyusdz::Interpolation>)0x0;
        AStack_818.elementSize.has_value_ = false;
        AStack_818.elementSize.contained = (storage_t<unsigned_int>)0x0;
        AStack_818.hidden.has_value_ = false;
        AStack_818.hidden.contained = (storage_t<bool>)0x0;
        AStack_818.comment.has_value_ = false;
        AStack_818.weight.contained = (storage_t<double>)0x0;
        AStack_818.connectability.has_value_ = false;
        AStack_818.bindMaterialAs.contained._16_8_ = 0;
        AStack_818.bindMaterialAs.contained._24_8_ = 0;
        AStack_818.bindMaterialAs.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0
        ;
        AStack_818.bindMaterialAs.contained._8_8_ = 0;
        args = &AStack_818.meta._M_t._M_impl.super__Rb_tree_header._M_header;
        AStack_818.meta._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        AStack_818.meta._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        AStack_818.comment.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
        AStack_818.comment.contained._8_8_ = 0;
        AStack_818.comment.contained._16_8_ = 0;
        AStack_818.comment.contained._24_8_ = 0;
        AStack_818.comment.contained._32_8_ = 0;
        AStack_818.comment.contained._40_8_ = 0;
        AStack_818.customData.has_value_ = false;
        AStack_818.customData.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
        AStack_818.customData.contained._8_8_ = 0;
        AStack_818.customData.contained._16_8_ = 0;
        AStack_818.customData.contained._24_8_ = 0;
        AStack_818.customData.contained._32_8_ = 0;
        AStack_818.customData.contained._40_8_ = 0;
        AStack_818.weight.has_value_ = false;
        AStack_818.connectability.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0
        ;
        AStack_818.connectability.contained._8_8_ = 0;
        AStack_818.connectability.contained._16_8_ = 0;
        AStack_818.connectability.contained._24_8_ = 0;
        AStack_818.outputName.has_value_ = false;
        AStack_818.outputName.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
        AStack_818.outputName.contained._8_8_ = 0;
        AStack_818.outputName.contained._16_8_ = 0;
        AStack_818.outputName.contained._24_8_ = 0;
        AStack_818.renderType.has_value_ = false;
        AStack_818.sdrMetadata.has_value_ = false;
        AStack_818.renderType.contained._16_8_ = 0;
        AStack_818.renderType.contained._24_8_ = 0;
        AStack_818.renderType.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
        AStack_818.renderType.contained._8_8_ = 0;
        AStack_818.displayName.has_value_ = false;
        AStack_818.sdrMetadata.contained._32_8_ = 0;
        AStack_818.sdrMetadata.contained._40_8_ = 0;
        AStack_818.sdrMetadata.contained._16_8_ = 0;
        AStack_818.sdrMetadata.contained._24_8_ = 0;
        AStack_818.sdrMetadata.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
        AStack_818.sdrMetadata.contained._8_8_ = 0;
        AStack_818.displayGroup.has_value_ = false;
        AStack_818.displayName.contained._16_8_ = 0;
        AStack_818.displayName.contained._24_8_ = 0;
        AStack_818.displayName.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
        AStack_818.displayName.contained._8_8_ = 0;
        AStack_818.bindMaterialAs.has_value_ = false;
        AStack_818.displayGroup.contained._16_8_ = 0;
        AStack_818.displayGroup.contained._24_8_ = 0;
        AStack_818.displayGroup.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
        AStack_818.displayGroup.contained._8_8_ = 0;
        local_830[0x10] = 0;
        stack0xfffffffffffff7e1 = 0;
        local_830._0_8_ = (pointer)0x0;
        local_830[8] = 0;
        local_830._9_7_ = 0;
        AStack_818.meta._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        AStack_818.stringData.
        super__Vector_base<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        AStack_818.stringData.
        super__Vector_base<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        AStack_818.stringData.
        super__Vector_base<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_8b8._32_4_ = Uniform;
        local_890._M_p = (pointer)&local_880;
        AStack_818.meta._M_t._M_impl.super__Rb_tree_header._M_header._M_left = args;
        AStack_818.meta._M_t._M_impl.super__Rb_tree_header._M_header._M_right = args;
        tinyusdz::value::TypeTraits<std::vector<int,std::allocator<int>>>::type_name_abi_cxx11_();
        ::std::__cxx11::string::_M_assign((string *)&local_890);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_610.dynamic != &local_600) {
          operator_delete(local_610.dynamic,local_600._M_allocated_capacity + 1);
        }
        if ((blendshape->pointIndices)._blocked == true) {
          local_858 = true;
        }
        if ((blendshape->pointIndices)._paths.
            super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
            super__Vector_impl_data._M_finish !=
            (blendshape->pointIndices)._paths.
            super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
            super__Vector_impl_data._M_start) {
          std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                    ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)local_830,
                     (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                     &(blendshape->pointIndices)._paths);
        }
        if ((blendshape->pointIndices)._attrib.has_value_ == true) {
          local_938 = (pointer *)CONCAT71(local_938._1_7_,1);
          ::std::vector<int,_std::allocator<int>_>::vector
                    (&local_930,
                     (vector<int,_std::allocator<int>_> *)
                     &(blendshape->pointIndices)._attrib.contained);
          fVar2 = local_938._0_1_;
          if (local_938._0_1_ == (fmt)0x1) {
            local_8e8._0_8_ =
                 linb::any::vtable_for_type<std::vector<int,std::allocator<int>>>()::table;
            this = (vector<int,_std::allocator<int>_> *)operator_new(0x18);
            ::std::vector<int,_std::allocator<int>_>::vector(this,&local_930);
            local_600._M_allocated_capacity =
                 (size_type)&linb::any::vtable_for_type<decltype(nullptr)>()::table;
            local_610.dynamic =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0x0;
            local_600._8_8_ = local_600._8_8_ & 0xffffffffffffff00;
            local_5f0._0_8_ = (pointer)0x0;
            local_5f0[8] = 0;
            local_5f0._9_7_ = 0;
            local_5f0[0x10] = 0;
            local_5f0._17_8_ = 0;
            local_8f8.dynamic = this;
            linb::any::operator=((any *)&local_610,(any *)&local_8f8);
            Attribute::set_var((Attribute *)local_8b8,(PrimVar *)&local_610);
            ::std::
            vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
            ::~vector((vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                       *)local_5f0);
            if ((undefined8 *)local_600._M_allocated_capacity != (undefined8 *)0x0) {
              (**(code **)(local_600._M_allocated_capacity + 0x20))(&local_610);
            }
            if ((pointer)local_8e8._0_8_ != (pointer)0x0) {
              (**(code **)(local_8e8._0_8_ + 0x20))(&local_8f8);
            }
          }
          else {
            local_8f8.dynamic = local_8e8;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_8f8,"[InternalError] Invalid TypedAttribute<{}> value.","");
            tinyusdz::value::TypeTraits<std::vector<int,std::allocator<int>>>::type_name_abi_cxx11_
                      ();
            fmt::format<std::__cxx11::string>
                      ((string *)&local_610,(fmt *)&local_8f8,(string *)(local_8e8 + 0x10),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
            ::std::__cxx11::string::_M_append((char *)&local_918,(ulong)local_610.dynamic);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_610.dynamic != &local_600) {
              operator_delete(local_610.dynamic,local_600._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_8e8._16_8_ != &local_8c8) {
              operator_delete((void *)local_8e8._16_8_,local_8c8._M_allocated_capacity + 1);
            }
            if ((vector<int,_std::allocator<int>_> *)local_8f8.dynamic !=
                (vector<int,_std::allocator<int>_> *)local_8e8) {
              operator_delete(local_8f8.dynamic,(ulong)(local_8e8._0_8_ + 1));
            }
          }
          if ((local_938._0_1_ == (fmt)0x1) &&
             (local_930.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0)) {
            operator_delete(local_930.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_930.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage -
                            (long)local_930.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start);
          }
          if (fVar2 != (fmt)0x0) goto LAB_00319187;
          bVar3 = false;
        }
        else {
LAB_00319187:
          AttrMetas::operator=(&AStack_818,&(blendshape->pointIndices)._metas);
          Property::Property((Property *)&local_610,(Attribute *)local_8b8,false);
          Property::operator=(out_prop,(Property *)&local_610);
          Property::~Property((Property *)&local_610);
          bVar3 = true;
        }
        AttrMetas::~AttrMetas(&AStack_818);
        ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::~vector
                  ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)local_830);
        ::std::
        vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
        ::~vector((vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                   *)local_850);
        pvVar7 = local_860;
        if (local_860 != (vtable_type *)0x0) {
          pvVar7 = (vtable_type *)(*local_860->destroy)(&local_870);
          local_860 = (vtable_type *)0x0;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_890._M_p != &local_880) {
          operator_delete(local_890._M_p,
                          CONCAT71(local_880._M_allocated_capacity._1_7_,local_880._M_local_buf[0])
                          + 1);
          pvVar7 = extraout_RAX_01;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_8b8._0_8_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(local_8b8 + 0x10)) {
          operator_delete((void *)local_8b8._0_8_,CONCAT71(local_8b8._17_7_,local_8b8[0x10]) + 1);
          pvVar7 = extraout_RAX_02;
        }
        if (!bVar3) {
          local_938 = &local_930.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_938,"Convert Property {} failed: {}\n","");
          fmt::format<char[13],std::__cxx11::string>
                    ((string *)local_8b8,(fmt *)&local_938,(string *)"pointIndices",
                     (char (*) [13])&local_918,in_R8);
          uVar5 = local_8b8._0_8_;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_8b8._0_8_ ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_8b8 + 0x10)) {
            local_600._8_8_ = local_8b8._24_8_;
            uVar5 = &local_600;
          }
          local_600._M_allocated_capacity._1_7_ = local_8b8._17_7_;
          local_600._M_local_buf[0] = local_8b8[0x10];
          (__return_storage_ptr__->contained).
          super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          .m_has_value = false;
          psVar1 = (size_type *)
                   ((long)&(__return_storage_ptr__->contained).
                           super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           .field_0 + 0x10);
          *(size_type **)
           &(__return_storage_ptr__->contained).
            super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            .field_0 = psVar1;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)uVar5 == &local_600) {
            *psVar1 = local_600._M_allocated_capacity;
            *(undefined8 *)
             ((long)&(__return_storage_ptr__->contained).
                     super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     .field_0 + 0x18) = local_600._8_8_;
          }
          else {
            (__return_storage_ptr__->contained).
            super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            .field_0.m_error._M_dataplus._M_p = (pointer)uVar5;
            *(size_type *)
             ((long)&(__return_storage_ptr__->contained).
                     super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     .field_0 + 0x10) = local_600._M_allocated_capacity;
            uVar5 = local_600._M_allocated_capacity;
          }
          (__return_storage_ptr__->contained).
          super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          .field_0.m_error._M_string_length = local_8b8._8_8_;
          goto LAB_0031905b;
        }
      }
      else {
        uVar5 = ::std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                        *)&blendshape->props,prop_name);
        if ((_Rb_tree_header *)uVar5 == &(blendshape->props)._M_t._M_impl.super__Rb_tree_header) {
          (__return_storage_ptr__->contained).
          super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          .m_has_value = true;
          (__return_storage_ptr__->contained).
          super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          .field_0.m_value = false;
          goto LAB_00319265;
        }
        ::std::__cxx11::string::_M_assign((string *)out_prop);
        (out_prop->_attrib)._varying_authored = (bool)((_Base_ptr)(uVar5 + 0x60))->field_0x4;
        (out_prop->_attrib)._variability = ((_Base_ptr)(uVar5 + 0x60))->_M_color;
        ::std::__cxx11::string::_M_assign((string *)&(out_prop->_attrib)._type_name);
        linb::any::operator=
                  ((any *)&(out_prop->_attrib)._var,(any *)&((_Base_ptr)(uVar5 + 0x80))->_M_parent);
        (out_prop->_attrib)._var._blocked = SUB41(((_Base_ptr)(uVar5 + 0xa0))->_M_color,0);
        ::std::
        vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
        ::operator=(&(out_prop->_attrib)._var._ts._samples,
                    (vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                     *)&((_Base_ptr)(uVar5 + 0xa0))->_M_parent);
        (out_prop->_attrib)._var._ts._dirty = SUB41(((_Base_ptr)(uVar5 + 0xc0))->_M_color,0);
        std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                  ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                   &(out_prop->_attrib)._paths,
                   (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                   &((_Base_ptr)(uVar5 + 0xc0))->_M_parent);
        AttrMetas::operator=(&(out_prop->_attrib)._metas,(AttrMetas *)(uVar5 + 0xe0));
        *(_Base_ptr *)&out_prop->_listOpQual = ((_Base_ptr)(uVar5 + 0x2e0))->_M_parent;
        (out_prop->_rel).type = *(Type *)&((_Base_ptr)(uVar5 + 0x2e0))->_M_left;
        Path::operator=(&(out_prop->_rel).targetPath,(Path *)&((_Base_ptr)(uVar5 + 0x2e0))->_M_right
                       );
        std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                  ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                   &(out_prop->_rel).targetPathVector,
                   (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                   &((_Base_ptr)(uVar5 + 0x3c0))->_M_parent);
        (out_prop->_rel).listOpQual = ((_Base_ptr)(uVar5 + 0x3e0))->_M_color;
        AttrMetas::operator=
                  (&(out_prop->_rel)._metas,(AttrMetas *)&((_Base_ptr)(uVar5 + 0x3e0))->_M_parent);
        (out_prop->_rel)._varying_authored = *(bool *)&((_Base_ptr)(uVar5 + 0x5e0))->_M_left;
        uVar6 = ::std::__cxx11::string::_M_assign((string *)&out_prop->_prop_value_type_name);
        pvVar7 = (vtable_type *)
                 CONCAT71((int7)((ulong)uVar6 >> 8),*(bool *)&((_Base_ptr)(uVar5 + 0x600))->_M_right
                         );
        out_prop->_has_custom = *(bool *)&((_Base_ptr)(uVar5 + 0x600))->_M_right;
      }
    }
LAB_0031925e:
    uVar5 = CONCAT71((int7)((ulong)pvVar7 >> 8),1);
    (__return_storage_ptr__->contained).
    super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .m_has_value = true;
    (__return_storage_ptr__->contained).
    super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .field_0.m_value = true;
  }
LAB_00319265:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_918._M_dataplus._M_p != &local_918.field_2) {
    operator_delete(local_918._M_dataplus._M_p,
                    CONCAT71(local_918.field_2._M_allocated_capacity._1_7_,
                             local_918.field_2._M_local_buf[0]) + 1);
    uVar5 = extraout_RAX_03;
  }
  return (expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)uVar5;
}

Assistant:

nonstd::expected<bool, std::string> GetPrimProperty(
    const BlendShape &blendshape, const std::string &prop_name,
    Property *out_prop) {
  if (!out_prop) {
    return nonstd::make_unexpected(
        "[InternalError] nullptr in output Property is not allowed.");
  }

  DCOUT("prop_name = " << prop_name);
  std::string err;

  TO_PROPERTY("offsets", blendshape.offsets)
  TO_PROPERTY("normalOffsets", blendshape.normalOffsets)
  TO_PROPERTY("pointIndices", blendshape.pointIndices)

  {
    const auto it = blendshape.props.find(prop_name);
    if (it == blendshape.props.end()) {
      // Attribute not found.
      return false;
    }

    (*out_prop) = it->second;
  }
  DCOUT("Prop found: " << prop_name
                       << ", ty = " << out_prop->value_type_name());
  return true;
}